

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpEventSubscribe.c
# Opt level: O0

UpnpEventSubscribe * UpnpEventSubscribe_new(void)

{
  UpnpString *pUVar1;
  s_UpnpEventSubscribe *p;
  
  p = (s_UpnpEventSubscribe *)calloc(1,0x18);
  if (p == (s_UpnpEventSubscribe *)0x0) {
    p = (s_UpnpEventSubscribe *)0x0;
  }
  else {
    pUVar1 = UpnpString_new();
    p->m_SID = pUVar1;
    pUVar1 = UpnpString_new();
    p->m_PublisherUrl = pUVar1;
  }
  return p;
}

Assistant:

UpnpEventSubscribe *UpnpEventSubscribe_new(void)
{
	struct s_UpnpEventSubscribe *p =
		calloc(1, sizeof(struct s_UpnpEventSubscribe));

	if (!p)
		return 0;

	/*p->m_ErrCode = 0;*/
	/*p->m_TimeOut = 0;*/
	p->m_SID = UpnpString_new();
	p->m_PublisherUrl = UpnpString_new();

	return (UpnpEventSubscribe *)p;
}